

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uchar *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  size_t __n;
  long in_FS_OFFSET;
  uchar tmpsig [64];
  uchar local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
  iVar4 = 0;
  iVar5 = 0;
  if (((inputlen != 0) && (inputlen != 1)) && (*input == '0')) {
    bVar2 = input[1];
    sVar9 = 2;
    iVar4 = iVar5;
    if ((char)bVar2 < '\0') {
      if (inputlen - 2 < (ulong)bVar2 - 0x80) goto LAB_008252d1;
      sVar9 = (ulong)bVar2 - 0x7e;
    }
    if (((sVar9 != inputlen) && (input[sVar9] == '\x02')) && (sVar9 + 1 != inputlen)) {
      sVar8 = sVar9 + 2;
      uVar6 = (ulong)input[sVar9 + 1];
      if ((char)input[sVar9 + 1] < '\0') {
        uVar1 = uVar6 - 0x80;
        if (inputlen - sVar8 < uVar1) goto LAB_008252d1;
        if (uVar1 != 0) {
          sVar9 = (sVar9 + uVar6) - 0x7e;
          uVar6 = 0;
          lVar14 = 0;
          puVar10 = input;
LAB_00825308:
          if (puVar10[sVar8] == '\0') goto code_r0x0082530f;
          if (uVar1 + lVar14 < 4) {
            uVar11 = -lVar14;
            uVar6 = 0;
            do {
              uVar6 = (ulong)input[uVar11 + sVar8] | uVar6 << 8;
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
            sVar8 = (sVar8 - lVar14) + uVar1 + lVar14;
            goto LAB_008251cf;
          }
          goto LAB_00825336;
        }
        uVar6 = 0;
        sVar9 = sVar8;
      }
      else {
LAB_008251cf:
        sVar9 = sVar8;
        if (inputlen - sVar8 < uVar6) goto LAB_008252d1;
      }
LAB_008251de:
      sVar8 = sVar9 + uVar6;
      if (((sVar8 != inputlen) && (input[sVar8] == '\x02')) && (sVar8 + 1 != inputlen)) {
        lVar14 = sVar8 + 2;
        __n = (size_t)input[sVar8 + 1];
        sVar7 = sVar9;
        if ((char)input[sVar8 + 1] < '\0') {
          uVar1 = __n - 0x80;
          if (uVar1 <= inputlen - lVar14) {
            if (uVar1 == 0) {
              __n = 0;
              lVar13 = lVar14;
              goto joined_r0x00825225;
            }
            lVar13 = sVar8 + __n + -0x7e;
            __n = 0;
            uVar11 = 0;
LAB_0082538f:
            if (input[uVar11 + lVar14] == '\0') goto code_r0x00825396;
            uVar12 = uVar1 - uVar11;
            if (uVar12 < 4) {
              lVar13 = lVar14 + uVar11;
              __n = 0;
              do {
                __n = (ulong)input[uVar11 + lVar14] | __n << 8;
                uVar11 = uVar11 + 1;
              } while (uVar1 != uVar11);
              lVar14 = lVar13 + uVar12;
              goto LAB_00825216;
            }
LAB_00825336:
            iVar4 = 0;
          }
        }
        else {
LAB_00825216:
          lVar13 = lVar14;
          if (__n <= inputlen - lVar14) {
joined_r0x00825225:
            do {
              if (uVar6 == 0) goto LAB_0082523d;
              if (input[sVar7] != '\0') {
                if (uVar6 < 0x21) goto LAB_0082523f;
                bVar3 = false;
                goto LAB_0082525e;
              }
              uVar6 = uVar6 - 1;
              sVar9 = sVar8;
              sVar7 = sVar7 + 1;
            } while( true );
          }
        }
      }
    }
  }
  goto LAB_008252d1;
code_r0x0082530f:
  lVar14 = lVar14 + -1;
  puVar10 = puVar10 + 1;
  if (uVar1 + lVar14 == 0) goto LAB_008251de;
  goto LAB_00825308;
code_r0x00825396:
  uVar11 = uVar11 + 1;
  if (uVar1 == uVar11) goto joined_r0x00825225;
  goto LAB_0082538f;
LAB_0082523d:
  uVar6 = 0;
  sVar7 = sVar9;
LAB_0082523f:
  __memcpy_chk(local_78 + (0x20 - uVar6),input + sVar7,uVar6,uVar6 + 0x20);
  bVar3 = true;
LAB_0082525e:
  lVar14 = lVar13;
  if (__n != 0) {
    lVar14 = lVar13 + __n;
    do {
      if (input[lVar13] != '\0') {
        if (__n < 0x21) goto LAB_00825280;
        goto LAB_008253c2;
      }
      lVar13 = lVar13 + 1;
      __n = __n - 1;
    } while (__n != 0);
  }
  __n = 0;
  lVar13 = lVar14;
LAB_00825280:
  memcpy((void *)((long)&local_38 - __n),input + lVar13,__n);
  if (bVar3) {
    iVar5 = secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
    iVar4 = 1;
    if (iVar5 != 0) goto LAB_008252d1;
  }
LAB_008253c2:
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static,sig,local_78);
  iVar4 = 1;
LAB_008252d1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    if (overflow) {
        /* Overwrite the result again with a correctly-parsed but invalid
           signature if parsing failed. */
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    return 1;
}